

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O0

void zmInvMont2(word *b,word *a,qr_o *r,void *stack)

{
  long lVar1;
  size_t in_RDX;
  word *in_RSI;
  word *in_RDI;
  word *unaff_retaddr;
  zm_mont_params_st *params;
  size_t k;
  word *in_stack_00000038;
  word *in_stack_00000040;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_RDX + 0x28);
  for (local_28 = zzAlmostInvMod(in_stack_00000040,in_stack_00000038,b,(size_t)a,r);
      local_28 < (ulong)(*(long *)(lVar1 + 8) << 1); local_28 = local_28 + 1) {
    zzDoubleMod(unaff_retaddr,in_RDI,in_RSI,in_RDX);
  }
  return;
}

Assistant:

static void zmInvMont2(word b[], const word a[], const qr_o* r, void* stack)
{
	register size_t k;
	const zm_mont_params_st* params;
	ASSERT(zmIsOperable(r));
	ASSERT(zmIsIn(a, r));
	params = (const zm_mont_params_st*)r->params;
	// b <- a^{-1} 2^k \mod mod
	k = zzAlmostInvMod(b, a, r->mod, r->n, stack);
	ASSERT(wwBitSize(r->mod, r->n) <= k);
	ASSERT(k <= 2 * wwBitSize(r->mod, r->n));
	// b <- a^{-1} R^2 \mod mod
	for (; k < 2 * params->l; ++k)
		zzDoubleMod(b, b, r->mod, r->n);
}